

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

bool anon_unknown.dwarf_a4b191::IsDescriptorResource(TType *type)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  iVar1 = (*type->_vptr_TType[7])();
  if (iVar1 == 0x10) {
    iVar1 = (*type->_vptr_TType[0xb])();
    if (((*(uint *)(CONCAT44(extraout_var,iVar1) + 8) & 0x7f) - 5 < 2) &&
       (iVar1 = (*type->_vptr_TType[0xb])(type),
       *(char *)(CONCAT44(extraout_var_00,iVar1) + 0x38) == '\0')) {
      iVar1 = (*type->_vptr_TType[0xb])(type);
      return (bool)(*(byte *)(CONCAT44(extraout_var_01,iVar1) + 0x2d) ^ 1);
    }
  }
  else {
    iVar1 = (*type->_vptr_TType[7])(type);
    if ((iVar1 == 0xe) || (iVar1 = (*type->_vptr_TType[7])(type), iVar1 == 0x11)) {
      iVar1 = (*type->_vptr_TType[0xb])(type);
      return (*(uint *)(CONCAT44(extraout_var_02,iVar1) + 8) & 0x7f) - 5 < 2;
    }
  }
  return false;
}

Assistant:

bool IsDescriptorResource(const glslang::TType& type)
{
    // uniform and buffer blocks are included, unless it is a push_constant
    if (type.getBasicType() == glslang::EbtBlock)
        return type.getQualifier().isUniformOrBuffer() &&
        ! type.getQualifier().isShaderRecord() &&
        ! type.getQualifier().isPushConstant();

    // non block...
    // basically samplerXXX/subpass/sampler/texture are all included
    // if they are the global-scope-class, not the function parameter
    // (or local, if they ever exist) class.
    if (type.getBasicType() == glslang::EbtSampler ||
        type.getBasicType() == glslang::EbtAccStruct)
        return type.getQualifier().isUniformOrBuffer();

    // None of the above.
    return false;
}